

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sit.c
# Opt level: O0

void take_gold(void)

{
  obj *poVar1;
  bool bVar2;
  int lost_money;
  obj *nobj;
  obj *otmp;
  
  bVar2 = false;
  nobj = invent;
  poVar1 = nobj;
  while (nobj = poVar1, nobj != (obj *)0x0) {
    poVar1 = nobj->nobj;
    if (nobj->oclass == '\f') {
      bVar2 = true;
      delobj(nobj);
    }
  }
  if (bVar2) {
    pline("You notice you have no money!");
    iflags.botl = '\x01';
  }
  else {
    pline("You feel a strange sensation.");
  }
  return;
}

Assistant:

void take_gold(void)
{
        struct obj *otmp, *nobj;
	int lost_money = 0;
	for (otmp = invent; otmp; otmp = nobj) {
		nobj = otmp->nobj;
		if (otmp->oclass == COIN_CLASS) {
			lost_money = 1;
			delobj(otmp);
		}
	}
	if (!lost_money)  {
		pline("You feel a strange sensation.");
	} else {
		pline("You notice you have no money!");
		iflags.botl = 1;
	}
}